

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.h
# Opt level: O1

cmCommand * __thiscall cmCTestBuildCommand::Clone(cmCTestBuildCommand *this)

{
  cmCTestBuildCommand *this_00;
  
  this_00 = (cmCTestBuildCommand *)operator_new(0xd8);
  cmCTestBuildCommand(this_00);
  (this_00->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest =
       (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  (this_00->super_cmCTestHandlerCommand).super_cmCTestCommand.CTestScriptHandler =
       (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTestScriptHandler;
  return (cmCommand *)this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    cmCTestBuildCommand* ni = new cmCTestBuildCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
    }